

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_4_ptr_riscv32
               (TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,
               uint32_t cofs,TCGv_ptr ptr,uint32_t oprsz,uint32_t maxsz,int32_t data,undefined1 *fn)

{
  uint32_t val;
  TCGv_i32 arg;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_ptr r_01;
  TCGv_ptr r_02;
  TCGv_i32 desc;
  TCGv_ptr a3;
  TCGv_ptr a2;
  TCGv_ptr a1;
  TCGv_ptr a0;
  TCGv_ptr ptr_local;
  uint32_t cofs_local;
  uint32_t bofs_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  val = simd_desc_riscv32(oprsz,maxsz,data);
  arg = tcg_const_i32_riscv32(tcg_ctx,val);
  r = tcg_temp_new_ptr(tcg_ctx);
  r_00 = tcg_temp_new_ptr(tcg_ctx);
  r_01 = tcg_temp_new_ptr(tcg_ctx);
  r_02 = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_ptr(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)dofs);
  tcg_gen_addi_ptr(tcg_ctx,r_00,tcg_ctx->cpu_env,(ulong)aofs);
  tcg_gen_addi_ptr(tcg_ctx,r_01,tcg_ctx->cpu_env,(ulong)bofs);
  tcg_gen_addi_ptr(tcg_ctx,r_02,tcg_ctx->cpu_env,(ulong)cofs);
  (*(code *)fn)(tcg_ctx,r,r_00,r_01,r_02,ptr,arg);
  tcg_temp_free_ptr(tcg_ctx,r);
  tcg_temp_free_ptr(tcg_ctx,r_00);
  tcg_temp_free_ptr(tcg_ctx,r_01);
  tcg_temp_free_ptr(tcg_ctx,r_02);
  tcg_temp_free_i32(tcg_ctx,arg);
  return;
}

Assistant:

void tcg_gen_gvec_4_ptr(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs,
                        uint32_t cofs, TCGv_ptr ptr, uint32_t oprsz,
                        uint32_t maxsz, int32_t data,
                        gen_helper_gvec_4_ptr *fn)
{
    TCGv_ptr a0, a1, a2, a3;
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, data));

    a0 = tcg_temp_new_ptr(tcg_ctx);
    a1 = tcg_temp_new_ptr(tcg_ctx);
    a2 = tcg_temp_new_ptr(tcg_ctx);
    a3 = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
    tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);
    tcg_gen_addi_ptr(tcg_ctx, a2, tcg_ctx->cpu_env, bofs);
    tcg_gen_addi_ptr(tcg_ctx, a3, tcg_ctx->cpu_env, cofs);

    fn(tcg_ctx, a0, a1, a2, a3, ptr, desc);

    tcg_temp_free_ptr(tcg_ctx, a0);
    tcg_temp_free_ptr(tcg_ctx, a1);
    tcg_temp_free_ptr(tcg_ctx, a2);
    tcg_temp_free_ptr(tcg_ctx, a3);
    tcg_temp_free_i32(tcg_ctx, desc);
}